

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O2

int tremove(lua_State *L)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  
  luaL_checktype(L,1,5);
  iVar1 = luaL_len(L,1);
  uVar2 = luaL_optinteger(L,2,(long)iVar1);
  iVar3 = (int)uVar2;
  if ((iVar1 != iVar3) && (iVar1 + 1 < iVar3 || iVar3 < 1)) {
    luaL_argerror(L,1,"position out of bounds");
  }
  lua_rawgeti(L,1,iVar3);
  while (iVar3 = (int)uVar2, iVar3 < iVar1) {
    lua_rawgeti(L,1,iVar3 + 1U);
    lua_rawseti(L,1,iVar3);
    uVar2 = (ulong)(iVar3 + 1U);
  }
  lua_pushnil(L);
  lua_rawseti(L,1,iVar3);
  return 1;
}

Assistant:

static int tremove (lua_State *L) {
  int size = aux_getn(L, 1);
  int pos = luaL_optint(L, 2, size);
  if (pos != size)  /* validate 'pos' if given */
    luaL_argcheck(L, 1 <= pos && pos <= size + 1, 1, "position out of bounds");
  lua_rawgeti(L, 1, pos);  /* result = t[pos] */
  for ( ; pos < size; pos++) {
    lua_rawgeti(L, 1, pos+1);
    lua_rawseti(L, 1, pos);  /* t[pos] = t[pos+1] */
  }
  lua_pushnil(L);
  lua_rawseti(L, 1, pos);  /* t[pos] = nil */
  return 1;
}